

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLRecognizer.cpp
# Opt level: O1

Encodings xercesc_4_0::XMLRecognizer::basicEncodingProbe(XMLByte *rawBuffer,XMLSize_t rawByteCount)

{
  undefined8 uVar1;
  XMLByte XVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (rawByteCount < 6) {
    if (rawByteCount < 2) {
      return UTF_8;
    }
  }
  else if (*(short *)(rawBuffer + 4) == 0x206c && *(int *)rawBuffer == 0x6d783f3c) {
    return UTF_8;
  }
  XVar2 = *rawBuffer;
  if (rawByteCount < 4) {
    if (XVar2 == 0xff) {
      if (rawBuffer[1] == 0xfe) {
        return UTF_16L;
      }
    }
    else if ((XVar2 == 0xfe) && (rawBuffer[1] == 0xff)) {
      return UTF_16B;
    }
  }
  else {
    if ((((XVar2 == '\0') && (rawBuffer[1] == '\0')) && (rawBuffer[2] == 0xfe)) &&
       (rawBuffer[3] == 0xff)) {
      return UCS_4B;
    }
    if (((XVar2 == 0xff) && (rawBuffer[1] == 0xfe)) &&
       ((rawBuffer[2] == '\0' && (rawBuffer[3] == '\0')))) {
      return UCS_4L;
    }
    if ((XVar2 == 0xfe) && (rawBuffer[1] == 0xff)) {
      return UTF_16B;
    }
    if ((XVar2 == 0xff) && (rawBuffer[1] == 0xfe)) {
      return UTF_16L;
    }
    if ((XVar2 == '<') || (XVar2 == '\0')) {
      if (0x17 < rawByteCount) {
        uVar1 = *(undefined8 *)(rawBuffer + 0x10);
        auVar5[0] = -((char)uVar1 == '\0');
        auVar5[1] = -((char)((ulong)uVar1 >> 8) == '\0');
        auVar5[2] = -((char)((ulong)uVar1 >> 0x10) == '\0');
        auVar5[3] = -((char)((ulong)uVar1 >> 0x18) == 'l');
        auVar5[4] = -((char)((ulong)uVar1 >> 0x20) == '\0');
        auVar5[5] = -((char)((ulong)uVar1 >> 0x28) == '\0');
        auVar5[6] = -((char)((ulong)uVar1 >> 0x30) == '\0');
        auVar5[7] = -((char)((ulong)uVar1 >> 0x38) == ' ');
        auVar5[8] = 0xff;
        auVar5[9] = 0xff;
        auVar5[10] = 0xff;
        auVar5[0xb] = 0xff;
        auVar5[0xc] = 0xff;
        auVar5[0xd] = 0xff;
        auVar5[0xe] = 0xff;
        auVar5[0xf] = 0xff;
        auVar3[0] = -(*rawBuffer == '\0');
        auVar3[1] = -(rawBuffer[1] == '\0');
        auVar3[2] = -(rawBuffer[2] == '\0');
        auVar3[3] = -(rawBuffer[3] == '<');
        auVar3[4] = -(rawBuffer[4] == '\0');
        auVar3[5] = -(rawBuffer[5] == '\0');
        auVar3[6] = -(rawBuffer[6] == '\0');
        auVar3[7] = -(rawBuffer[7] == '?');
        auVar3[8] = -(rawBuffer[8] == '\0');
        auVar3[9] = -(rawBuffer[9] == '\0');
        auVar3[10] = -(rawBuffer[10] == '\0');
        auVar3[0xb] = -(rawBuffer[0xb] == 'x');
        auVar3[0xc] = -(rawBuffer[0xc] == '\0');
        auVar3[0xd] = -(rawBuffer[0xd] == '\0');
        auVar3[0xe] = -(rawBuffer[0xe] == '\0');
        auVar3[0xf] = -(rawBuffer[0xf] == 'm');
        auVar3 = auVar3 & auVar5;
        if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff) {
          return UCS_4B;
        }
        uVar1 = *(undefined8 *)(rawBuffer + 0x10);
        auVar6[0] = -((char)uVar1 == 'l');
        auVar6[1] = -((char)((ulong)uVar1 >> 8) == '\0');
        auVar6[2] = -((char)((ulong)uVar1 >> 0x10) == '\0');
        auVar6[3] = -((char)((ulong)uVar1 >> 0x18) == '\0');
        auVar6[4] = -((char)((ulong)uVar1 >> 0x20) == ' ');
        auVar6[5] = -((char)((ulong)uVar1 >> 0x28) == '\0');
        auVar6[6] = -((char)((ulong)uVar1 >> 0x30) == '\0');
        auVar6[7] = -((char)((ulong)uVar1 >> 0x38) == '\0');
        auVar6[8] = 0xff;
        auVar6[9] = 0xff;
        auVar6[10] = 0xff;
        auVar6[0xb] = 0xff;
        auVar6[0xc] = 0xff;
        auVar6[0xd] = 0xff;
        auVar6[0xe] = 0xff;
        auVar6[0xf] = 0xff;
        auVar4[0] = -(*rawBuffer == '<');
        auVar4[1] = -(rawBuffer[1] == '\0');
        auVar4[2] = -(rawBuffer[2] == '\0');
        auVar4[3] = -(rawBuffer[3] == '\0');
        auVar4[4] = -(rawBuffer[4] == '?');
        auVar4[5] = -(rawBuffer[5] == '\0');
        auVar4[6] = -(rawBuffer[6] == '\0');
        auVar4[7] = -(rawBuffer[7] == '\0');
        auVar4[8] = -(rawBuffer[8] == 'x');
        auVar4[9] = -(rawBuffer[9] == '\0');
        auVar4[10] = -(rawBuffer[10] == '\0');
        auVar4[0xb] = -(rawBuffer[0xb] == '\0');
        auVar4[0xc] = -(rawBuffer[0xc] == 'm');
        auVar4[0xd] = -(rawBuffer[0xd] == '\0');
        auVar4[0xe] = -(rawBuffer[0xe] == '\0');
        auVar4[0xf] = -(rawBuffer[0xf] == '\0');
        auVar4 = auVar4 & auVar6;
        if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff) {
          return UCS_4L;
        }
      }
      if (0xb < rawByteCount) {
        if (*(int *)(rawBuffer + 8) == 0x20006c00 && *(long *)rawBuffer == 0x6d0078003f003c00) {
          return UTF_16B;
        }
        if (*(int *)(rawBuffer + 8) == 0x20006c && *(long *)rawBuffer == 0x6d0078003f003c) {
          return UTF_16L;
        }
      }
    }
    if ((6 < rawByteCount) &&
       (*(short *)(rawBuffer + 4) == 0x4093 && *(int *)rawBuffer == -0x6b5890b4)) {
      return EBCDIC;
    }
  }
  return UTF_8;
}

Assistant:

XMLRecognizer::Encodings
XMLRecognizer::basicEncodingProbe(  const   XMLByte* const  rawBuffer
                                    , const XMLSize_t       rawByteCount)
{
    //
    //  As an optimization to check the 90% case, check first for the ASCII
    //  sequence '<?xml', which means its either US-ASCII, UTF-8, or some
    //  other encoding that we don't do manually but which happens to share
    //  the US-ASCII code points for these characters. So just return UTF-8
    //  to get us through the first line.
    //
    if (rawByteCount >= fgASCIIPreLen)
    {
        if (!memcmp(rawBuffer, fgASCIIPre, fgASCIIPreLen))
            return UTF_8;
    }

    //
    //  If the count of raw bytes is less than 2, it cannot be anything
    //  we understand, so return UTF-8 as a fallback.
    //
    if (rawByteCount < 2)
        return UTF_8;
         
    //  
    //  We have two to four bytes, so lets check for a UTF-16 BOM. That
    //  is quick to check and enough to identify two major encodings.   
    // 

    if (rawByteCount < 4)
    {
        if ((rawBuffer[0] == 0xFE) && (rawBuffer[1] == 0xFF))
            return UTF_16B;
        else if ((rawBuffer[0] == 0xFF) && (rawBuffer[1] == 0xFE))
            return UTF_16L;
        else 
            return UTF_8;
    }

    /***
     *    F.1 Detection Without External Encoding Information
     *
     *    Because each XML entity not accompanied by external encoding information and 
     *    not in UTF-8 or UTF-16 encoding must begin with an XML encoding declaration, 
     *    in which the first characters must be '<?xml', any conforming processor can detect, 
     *    after two to four octets of input, which of the following cases apply. 
     *
     *    In reading this list, it may help to know that in UCS-4, '<' is "#x0000003C" and 
     *    '?' is "#x0000003F", and the Byte Order Mark required of UTF-16 data streams is 
     *    "#xFEFF". The notation ## is used to denote any byte value except that two consecutive 
     *    ##s cannot be both 00.
     *
     *    With a Byte Order Mark:
     *
     *    00 00 FE FF           UCS-4,    big-endian machine    (1234 order) 
     *    FF FE 00 00           UCS-4,    little-endian machine (4321 order) 
     *    00 00 FF FE           UCS-4,    unusual octet order   (2143) 
     *    FE FF 00 00           UCS-4,    unusual octet order   (3412) 
     *    FE FF ## ##           UTF-16,   big-endian 
     *    FF FE ## ##           UTF-16,   little-endian 
     *    EF BB BF              UTF-8 
     *
     ***/

    //
    //  We have at least four bytes, so we can check all BOM
    //  for UCS-4BE, UCS-4LE, UTF-16BE and UTF-16LE as well.
    //
    if ((rawBuffer[0] == 0x00) && (rawBuffer[1] == 0x00) && (rawBuffer[2] == 0xFE) && (rawBuffer[3] == 0xFF))
        return UCS_4B;
    else if ((rawBuffer[0] == 0xFF) && (rawBuffer[1] == 0xFE) && (rawBuffer[2] == 0x00) && (rawBuffer[3] == 0x00))
        return UCS_4L;
    else if ((rawBuffer[0] == 0xFE) && (rawBuffer[1] == 0xFF))
        return UTF_16B;
    else if ((rawBuffer[0] == 0xFF) && (rawBuffer[1] == 0xFE))
        return UTF_16L;

    //
    //  We have at least 4 bytes. So lets check the 4 byte sequences that
    //  indicate other UTF-16 and UCS encodings.
    //
    if ((rawBuffer[0] == 0x00) || (rawBuffer[0] == 0x3C))
    {
        if (rawByteCount >= fgUCS4PreLen && !memcmp(rawBuffer, fgUCS4BPre, fgUCS4PreLen))
            return UCS_4B;
        else if (rawByteCount >= fgUCS4PreLen && !memcmp(rawBuffer, fgUCS4LPre, fgUCS4PreLen))
            return UCS_4L;
        else if (rawByteCount >= fgUTF16PreLen && !memcmp(rawBuffer, fgUTF16BPre, fgUTF16PreLen))
            return UTF_16B;
        else if (rawByteCount >= fgUTF16PreLen && !memcmp(rawBuffer, fgUTF16LPre, fgUTF16PreLen))
            return UTF_16L;
    }

    //
    //  See if we have enough bytes to possibly match the EBCDIC prefix.
    //  If so, try it.
    //
    if (rawByteCount > fgEBCDICPreLen)
    {
        if (!memcmp(rawBuffer, fgEBCDICPre, fgEBCDICPreLen))
            return EBCDIC;
    }

    //
    //  Does not seem to be anything we know, so go with UTF-8 to get at
    //  least through the first line and see what it really is.
    //
    return UTF_8;
}